

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_curve.cxx
# Opt level: O3

void __thiscall
Fl_Graphics_Driver::curve
          (Fl_Graphics_Driver *this,double X0,double Y0,double X1,double Y1,double X2,double Y2,
          double X3,double Y3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dStack_30;
  undefined4 local_28;
  
  dVar11 = transform_x(fl_graphics_driver,X0,Y0);
  dVar10 = transform_y(fl_graphics_driver,X0,Y0);
  local_28 = SUB84(dVar11,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])(local_28,SUB84(dVar10,0));
  dVar1 = transform_x(fl_graphics_driver,X1,Y1);
  dVar13 = transform_y(fl_graphics_driver,X1,Y1);
  dVar12 = transform_x(fl_graphics_driver,X2,Y2);
  dVar14 = transform_y(fl_graphics_driver,X2,Y2);
  dVar2 = transform_x(fl_graphics_driver,X3,Y3);
  dVar3 = transform_y(fl_graphics_driver,X3,Y3);
  dVar5 = ABS(-(dVar10 - dVar14) * (dVar2 - dVar1) + (dVar3 - dVar13) * (dVar11 - dVar12));
  dVar6 = ABS(-(dVar10 - dVar3) * (dVar12 - dVar1) + (dVar14 - dVar13) * (dVar11 - dVar2));
  if (dVar6 <= dVar5) {
    dVar6 = dVar5;
  }
  uVar8 = (uint)(SQRT(dVar6) * 0.25);
  if (1 < (int)uVar8) {
    uVar7 = 100;
    if (uVar8 < 100) {
      uVar7 = uVar8;
    }
    dVar15 = 1.0 / (double)(int)uVar7;
    dVar5 = (dVar1 * 3.0 + dVar12 * -3.0 + dVar2) - dVar11;
    dVar6 = (dVar13 * 3.0 + dVar14 * -3.0 + dVar3) - dVar10;
    dVar12 = ((dVar12 - (dVar1 + dVar1)) + dVar11) * 3.0;
    dVar14 = ((dVar14 - (dVar13 + dVar13)) + dVar10) * 3.0;
    dVar1 = ((dVar5 * dVar15 + dVar12) * dVar15 + (dVar1 - dVar11) * 3.0) * dVar15;
    dStack_30 = ((dVar6 * dVar15 + dVar14) * dVar15 + (dVar13 - dVar10) * 3.0) * dVar15;
    if (uVar8 != 2) {
      dVar13 = (dVar12 + dVar12) * dVar15 * dVar15;
      dVar12 = (dVar14 + dVar14) * dVar15 * dVar15;
      uVar8 = 3;
      if (3 < uVar7) {
        uVar8 = uVar7;
      }
      iVar9 = uVar8 - 2;
      do {
        dVar12 = dVar12 + dVar6 * 6.0 * dVar15 * dVar15 * dVar15;
        dVar13 = dVar13 + dVar5 * 6.0 * dVar15 * dVar15 * dVar15;
        dVar11 = dVar11 + dVar1;
        dVar10 = dVar10 + dStack_30;
        dVar1 = dVar1 + dVar13;
        auVar4._8_4_ = SUB84(dStack_30 + dVar12,0);
        auVar4._0_8_ = dVar1;
        auVar4._12_4_ = (int)((ulong)(dStack_30 + dVar12) >> 0x20);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])();
        dStack_30 = auVar4._8_8_;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])
              (SUB84(dVar11 + dVar1,0),SUB84(dStack_30 + dVar10,0));
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x29])(SUB84(dVar2,0),SUB84(dVar3,0));
  return;
}

Assistant:

void Fl_Graphics_Driver::curve(double X0, double Y0,
	      double X1, double Y1,
	      double X2, double Y2,
	      double X3, double Y3) {

  double x = fl_transform_x(X0,Y0);
  double y = fl_transform_y(X0,Y0);

  // draw point 0:
  fl_transformed_vertex(x,y);

  double x1 = fl_transform_x(X1,Y1);
  double yy1 = fl_transform_y(X1,Y1);
  double x2 = fl_transform_x(X2,Y2);
  double y2 = fl_transform_y(X2,Y2);
  double x3 = fl_transform_x(X3,Y3);
  double y3 = fl_transform_y(X3,Y3);

  // find the area:
  double a = fabs((x-x2)*(y3-yy1)-(y-y2)*(x3-x1));
  double b = fabs((x-x3)*(y2-yy1)-(y-y3)*(x2-x1));
  if (b > a) a = b;

  // use that to guess at the number of segments:
  int n = int(sqrt(a)/4);
  if (n > 1) {
    if (n > 100) n = 100; // make huge curves not hang forever

    double e = 1.0/n;

    // calculate the coefficients of 3rd order equation:
    double xa = (x3-3*x2+3*x1-x);
    double xb = 3*(x2-2*x1+x);
    double xc = 3*(x1-x);
    // calculate the forward differences:
    double dx1 = ((xa*e+xb)*e+xc)*e;
    double dx3 = 6*xa*e*e*e;
    double dx2 = dx3 + 2*xb*e*e;

    // calculate the coefficients of 3rd order equation:
    double ya = (y3-3*y2+3*yy1-y);
    double yb = 3*(y2-2*yy1+y);
    double yc = 3*(yy1-y);
    // calculate the forward differences:
    double dy1 = ((ya*e+yb)*e+yc)*e;
    double dy3 = 6*ya*e*e*e;
    double dy2 = dy3 + 2*yb*e*e;

    // draw points 1 .. n-2:
    for (int m=2; m<n; m++) {
      x += dx1;
      dx1 += dx2;
      dx2 += dx3;
      y += dy1;
      dy1 += dy2;
      dy2 += dy3;
      fl_transformed_vertex(x,y);
    }

    // draw point n-1:
    fl_transformed_vertex(x+dx1, y+dy1);
  }

  // draw point n:
  fl_transformed_vertex(x3,y3);
}